

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestStreamingImpl::doStreamJ(TestStreamingImpl *this,DoStreamJContext context)

{
  int *piVar1;
  SourceLocation location;
  int iVar2;
  PromiseFulfillerPair<void> paf;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_68;
  Fault in_stack_ffffffffffffffb0;
  CapTableReader *in_stack_ffffffffffffffb8;
  PromiseFulfiller<void> *in_stack_ffffffffffffffc0;
  uint local_30;
  StreamingCallContext<capnproto_test::capnp::test::TestStreaming::DoStreamJParams> local_20;
  
  StreamingCallContext<capnproto_test::capnp::test::TestStreaming::DoStreamJParams>::getParams
            ((Reader *)&stack0xffffffffffffffb0,&local_20);
  iVar2 = 0;
  if (0x1f < local_30) {
    iVar2 = *(int *)&(in_stack_ffffffffffffffc0->super_PromiseRejector)._vptr_PromiseRejector;
  }
  piVar1 = (int *)((long)&context.hook[1]._vptr_CallContextHook + 4);
  *piVar1 = *piVar1 + iVar2;
  if (*(char *)&context.hook[4]._vptr_CallContextHook == '\x01') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              ((Fault *)&stack0xffffffffffffffb0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
               ,0x161,FAILED,(char *)0x0,"\"throw requested\"",(char (*) [16])"throw requested");
    kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffffb0);
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    location.function = (char *)in_stack_ffffffffffffffb8;
    location.fileName = (char *)in_stack_ffffffffffffffb0.exception;
    location._16_8_ = in_stack_ffffffffffffffc0;
    kj::newPromiseAndFulfiller<void>(location);
    kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(context.hook + 2),&local_68);
    kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_68);
    (this->super_Server)._vptr_Server = (_func_int **)in_stack_ffffffffffffffb0.exception;
    kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair
              ((PromiseFulfillerPair<void> *)&stack0xffffffffffffffb0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> doStreamJ(DoStreamJContext context) override {
    jSum += context.getParams().getJ();

    if (jShouldThrow) {
      KJ_FAIL_ASSERT("throw requested") { break; }
      return kj::READY_NOW;
    }

    auto paf = kj::newPromiseAndFulfiller<void>();
    fulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }